

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseSIMDLoadStoreInstr<wabt::SimdStoreLaneExpr>
          (WastParser *this,Location loc,Token token,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  undefined8 this_00;
  bool bVar1;
  SimdStoreLaneExpr *this_01;
  Var local_128;
  Opcode local_e0;
  Enum local_dc;
  size_t local_d8;
  char *local_d0;
  size_t local_c8;
  undefined8 local_c0;
  Enum local_b4;
  uint64_t uStack_b0;
  Result result;
  uint64_t lane_idx;
  Address align;
  Address offset;
  size_t local_90;
  char *local_88;
  size_t local_80;
  undefined8 local_78;
  Enum local_70;
  byte local_69;
  undefined1 local_68 [7];
  bool try_read_mem_index;
  Var memidx;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  memidx.field_2._24_8_ = out_expr;
  ErrorUnlessOpcodeEnabled(this,&token);
  Var::Var((Var *)local_68,0,&loc);
  bVar1 = Features::multi_memory_enabled(&this->options_->features);
  if (bVar1) {
    local_69 = 1;
    bVar1 = PeekMatch(this,Last_Literal,0);
    if ((((bVar1) && (bVar1 = PeekMatch(this,OffsetEqNat,1), !bVar1)) &&
        (bVar1 = PeekMatch(this,AlignEqNat,1), !bVar1)) &&
       (bVar1 = PeekMatch(this,Last_Literal,1), !bVar1)) {
      local_69 = 0;
    }
    if ((local_69 & 1) != 0) {
      local_90 = loc.filename._M_len;
      local_88 = loc.filename._M_str;
      local_80 = (size_t)loc.field_1.field_1.offset;
      local_78 = loc.field_1._8_8_;
      local_70 = (Enum)ParseMemidx(this,loc,(Var *)local_68);
      bVar1 = Failed((Result)local_70);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_001bbba8;
      }
    }
  }
  ParseOffsetOpt(this,&align);
  ParseAlignOpt(this,&lane_idx);
  uStack_b0 = 0;
  local_d8 = loc.filename._M_len;
  local_d0 = loc.filename._M_str;
  local_c8 = (size_t)loc.field_1.field_1.offset;
  local_c0 = loc.field_1._8_8_;
  local_dc = (Enum)ParseSimdLane(this,loc,&stack0xffffffffffffff50);
  local_b4 = local_dc;
  bVar1 = Failed((Result)local_dc);
  this_00 = memidx.field_2._24_8_;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_01 = (SimdStoreLaneExpr *)operator_new(0xa8);
    local_e0 = Token::opcode(&token);
    Var::Var(&local_128,(Var *)local_68);
    SimdStoreLaneExpr::SimdStoreLaneExpr(this_01,local_e0,&local_128,lane_idx,align,uStack_b0,&loc);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)this_00,(pointer)this_01)
    ;
    Var::~Var(&local_128);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
LAB_001bbba8:
  offset._4_4_ = 1;
  Var::~Var((Var *)local_68);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseSIMDLoadStoreInstr(Location loc,
                                           Token token,
                                           std::unique_ptr<Expr>* out_expr) {
  ErrorUnlessOpcodeEnabled(token);

  Var memidx(0, loc);

  if (options_->features.multi_memory_enabled()) {
    // We have to be a little careful when reading the memeory index.
    // If there is just a single integer folloing the instruction that
    // represents the lane index, so we check for either a pair of intergers
    // or an integers followed by offset= or align=.
    bool try_read_mem_index = true;
    if (PeekMatch(TokenType::Nat)) {
      // The next token could be a memory index or a lane index
      if (!PeekMatch(TokenType::OffsetEqNat, 1) &&
          !PeekMatch(TokenType::AlignEqNat, 1) &&
          !PeekMatch(TokenType::Nat, 1)) {
        try_read_mem_index = false;
      }
    }
    if (try_read_mem_index) {
      CHECK_RESULT(ParseMemidx(loc, &memidx));
    }
  }
  Address offset;
  Address align;
  ParseOffsetOpt(&offset);
  ParseAlignOpt(&align);

  uint64_t lane_idx = 0;
  Result result = ParseSimdLane(loc, &lane_idx);

  if (Failed(result)) {
    return Result::Error;
  }

  out_expr->reset(new T(token.opcode(), memidx, align, offset, lane_idx, loc));
  return Result::Ok;
}